

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O3

void __thiscall
Lib::Set<Kernel::Literal_*,_Lib::DefaultHash>::expand
          (Set<Kernel::Literal_*,_Lib::DefaultHash> *this)

{
  long lVar1;
  Cell *pCVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  Cell *pCVar6;
  Cell *pCVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int iVar13;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  bool dummy;
  bool local_39;
  Literal *local_38;
  
  iVar5 = 0x1f;
  if (this->_capacity != 0) {
    iVar5 = this->_capacity * 2;
  }
  lVar9 = (long)iVar5;
  pCVar2 = this->_entries;
  uVar10 = lVar9 * 0x10;
  if (iVar5 == 0) {
    pCVar6 = (Cell *)FixedSizeAllocator<8UL>::alloc
                               ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else {
    if (uVar10 < 0x11) {
      pCVar6 = (Cell *)FixedSizeAllocator<16UL>::alloc
                                 ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18)
                                 );
    }
    else if (uVar10 < 0x19) {
      pCVar6 = (Cell *)FixedSizeAllocator<24UL>::alloc
                                 ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30)
                                 );
    }
    else if (uVar10 < 0x21) {
      pCVar6 = (Cell *)FixedSizeAllocator<32UL>::alloc
                                 ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48)
                                 );
    }
    else if (uVar10 < 0x31) {
      pCVar6 = (Cell *)FixedSizeAllocator<48UL>::alloc
                                 ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60)
                                 );
    }
    else if (uVar10 < 0x41) {
      pCVar6 = (Cell *)FixedSizeAllocator<64UL>::alloc
                                 ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78)
                                 );
    }
    else {
      pCVar6 = (Cell *)::operator_new(uVar10,0x10);
    }
    auVar4 = _DAT_0084f040;
    auVar3 = _DAT_0084f030;
    auVar12 = _DAT_0084f020;
    lVar1 = lVar9 + -1;
    auVar11._8_4_ = (int)lVar1;
    auVar11._0_8_ = lVar1;
    auVar11._12_4_ = (int)((ulong)lVar1 >> 0x20);
    pCVar7 = pCVar6 + 3;
    uVar10 = 0;
    auVar11 = auVar11 ^ _DAT_0084f040;
    do {
      auVar14._8_4_ = (int)uVar10;
      auVar14._0_8_ = uVar10;
      auVar14._12_4_ = (int)(uVar10 >> 0x20);
      auVar15 = (auVar14 | auVar3) ^ auVar4;
      iVar13 = auVar11._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar13 && auVar11._0_4_ < auVar15._0_4_ ||
                  iVar13 < auVar15._4_4_) & 1)) {
        pCVar7[-3].code = 0;
      }
      if ((auVar15._12_4_ != auVar11._12_4_ || auVar15._8_4_ <= auVar11._8_4_) &&
          auVar15._12_4_ <= auVar11._12_4_) {
        pCVar7[-2].code = 0;
      }
      auVar14 = (auVar14 | auVar12) ^ auVar4;
      iVar16 = auVar14._4_4_;
      if (iVar16 <= iVar13 && (iVar16 != iVar13 || auVar14._0_4_ <= auVar11._0_4_)) {
        pCVar7[-1].code = 0;
        pCVar7->code = 0;
      }
      uVar10 = uVar10 + 4;
      pCVar7 = pCVar7 + 4;
    } while ((lVar9 + 3U & 0xfffffffffffffffc) != uVar10);
  }
  this->_entries = pCVar6;
  auVar12._8_4_ = iVar5 >> 0x1f;
  auVar12._0_8_ = lVar9;
  auVar12._12_4_ = 0x45300000;
  this->_afterLast = pCVar6 + lVar9;
  this->_maxEntries =
       (int)(((auVar12._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar5) - 4503599627370496.0)) * 0.8);
  iVar13 = this->_capacity;
  this->_capacity = iVar5;
  uVar8 = this->_size;
  this->_nonemptyCells = 0;
  this->_size = 0;
  if (uVar8 != 0) {
    pCVar6 = pCVar2;
    do {
      do {
        pCVar7 = pCVar6;
        pCVar6 = pCVar7 + 1;
      } while (pCVar7->code < 2);
      local_38 = pCVar7->value;
      Set<Kernel::Literal*,Lib::DefaultHash>::
      rawFindOrInsert<Lib::Set<Kernel::Literal*,Lib::DefaultHash>::insert(Kernel::Literal*,unsigned_int)::_lambda()_1_,Lib::Set<Kernel::Literal*,Lib::DefaultHash>::insert(Kernel::Literal*,unsigned_int)::_lambda(auto:1)_1_>
                ((Set<Kernel::Literal*,Lib::DefaultHash> *)this,(anon_class_8_1_ba1d8281)&local_38,
                 pCVar7->code,(anon_class_8_1_ba1d8281)&local_38,&local_39);
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  if (pCVar2 != (Cell *)0x0) {
    if (iVar13 == 0) {
      *(undefined8 *)pCVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pCVar2;
    }
    else {
      uVar10 = (long)iVar13 * 0x10;
      if (uVar10 < 0x11) {
        *(undefined8 *)pCVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pCVar2;
      }
      else if (uVar10 < 0x19) {
        *(undefined8 *)pCVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pCVar2;
      }
      else if (uVar10 < 0x21) {
        *(undefined8 *)pCVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pCVar2;
      }
      else if (uVar10 < 0x31) {
        *(undefined8 *)pCVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pCVar2;
      }
      else if (uVar10 < 0x41) {
        *(undefined8 *)pCVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pCVar2;
      }
      else {
        operator_delete(pCVar2,0x10);
      }
    }
  }
  return;
}

Assistant:

void expand()
  {
    size_t newCapacity = _capacity ? _capacity * 2 : 31;
    Cell* oldEntries = _entries;

    void* mem = ALLOC_KNOWN(newCapacity*sizeof(Cell),"Set::Cell");

    _entries = array_new<Cell>(mem, newCapacity);
    _afterLast = _entries + newCapacity;
    _maxEntries = (int)(newCapacity * 0.8);
    size_t oldCapacity = _capacity;
    _capacity = newCapacity;

    // experiments using (a) random numbers (b) consecutive numbers
    // and 30,000,000 allocations
    // 0.6 :  8.49 7.55
    // 0.7 :  9.19 7.71
    // 0.8 :  9.10 8.44
    // 0.9 :  9.34 7.36 (fewer allocations (21 vs. 22), fewer cache faults)
    // 0.95: 10.21 7.48
    // copy old entries
    Cell* current = oldEntries;
    int remaining = _size;
    _nonemptyCells = 0;
    _size = 0;
    while (remaining != 0) {
      // find first occupied cell
      while (! current->occupied()) {
	current++;
      }
      // now current is occupied
      insert(current->value,current->code);
      current ++;
      remaining --;
    }

    if (oldEntries) {
      array_delete(oldEntries,oldCapacity);
      DEALLOC_KNOWN(oldEntries,oldCapacity*sizeof(Cell),"Set::Cell");
    }
  }